

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exorList.c
# Opt level: O0

int IteratorCubePairNext(void)

{
  int local_c;
  int fEntryFound;
  
  local_c = 0;
  if (s_Iter.fStarted == 0) {
    __assert_fail("s_Iter.fStarted",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/exor/exorList.c"
                  ,0x435,"int IteratorCubePairNext()");
  }
  pQ = s_Que + s_Iter.Dist;
  do {
    if (pQ->PosOut == s_Iter.PosStop) {
LAB_003d8a7d:
      if (local_c == 0) {
        s_Iter.fStarted = 0;
      }
      else {
        *s_Iter.ppC1 = pQ->pC1[pQ->PosOut];
        *s_Iter.ppC2 = pQ->pC2[pQ->PosOut];
        pQ->PosOut = (pQ->PosOut + 1) % s_nPosAlloc;
      }
      return local_c;
    }
    p1 = pQ->pC1[pQ->PosOut];
    p2 = pQ->pC2[pQ->PosOut];
    if ((p1->ID == pQ->ID1[pQ->PosOut]) && (p2->ID == pQ->ID2[pQ->PosOut])) {
      local_c = 1;
      goto LAB_003d8a7d;
    }
    pQ->PosOut = (pQ->PosOut + 1) % s_nPosAlloc;
  } while( true );
}

Assistant:

int IteratorCubePairNext()
// gives the next VALID cube pair (the previous one is automatically dequequed)
{
    int fEntryFound = 0;
    assert( s_Iter.fStarted );

    // go through the entries while there is something in the queque
    for ( pQ = &s_Que[ s_Iter.Dist ]; pQ->PosOut != s_Iter.PosStop; pQ->PosOut = (pQ->PosOut+1)%s_nPosAlloc )
    {
        p1 = pQ->pC1[ pQ->PosOut ];
        p2 = pQ->pC2[ pQ->PosOut ];

        // check whether the entry is valid
        if ( p1->ID == pQ->ID1[ pQ->PosOut ] && 
             p2->ID == pQ->ID2[ pQ->PosOut ] ) //&&
             //p1->x + p1->y + p2->x + p2->y > s_Iter.CutValue )
        {
             fEntryFound = 1;
             break;
        }
    }

    if ( fEntryFound )
    { // write the result into the pick-up place
        *(s_Iter.ppC1) = pQ->pC1[ pQ->PosOut ];
        *(s_Iter.ppC2) = pQ->pC2[ pQ->PosOut ];

        pQ->PosOut = (pQ->PosOut+1)%s_nPosAlloc;
    }
    else // iteration has finished
        s_Iter.fStarted = 0;

    return fEntryFound;
}